

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void alloc_parser_working_data(Parser *p)

{
  PNode **ppPVar1;
  SNode **ppSVar2;
  Parser *p_local;
  
  (p->pnode_hash).i = 10;
  (p->pnode_hash).m = d_prime2[(p->pnode_hash).i];
  ppPVar1 = (PNode **)malloc((ulong)(p->pnode_hash).m << 3);
  (p->pnode_hash).v = ppPVar1;
  memset((p->pnode_hash).v,0,(ulong)(p->pnode_hash).m << 3);
  (p->snode_hash).i = 8;
  (p->snode_hash).m = d_prime2[(p->snode_hash).i];
  ppSVar2 = (SNode **)malloc((ulong)(p->snode_hash).m << 3);
  (p->snode_hash).v = ppSVar2;
  memset((p->snode_hash).v,0,(ulong)(p->snode_hash).m << 3);
  p->nshift_results = 0;
  p->ncode_shifts = 0;
  return;
}

Assistant:

static void alloc_parser_working_data(Parser *p) {
  p->pnode_hash.i = PNODE_HASH_INITIAL_SIZE_INDEX;
  p->pnode_hash.m = d_prime2[p->pnode_hash.i];
  p->pnode_hash.v = (PNode **)MALLOC(p->pnode_hash.m * sizeof(*p->pnode_hash.v));
  memset(p->pnode_hash.v, 0, p->pnode_hash.m * sizeof(*p->pnode_hash.v));
  p->snode_hash.i = SNODE_HASH_INITIAL_SIZE_INDEX;
  p->snode_hash.m = d_prime2[p->snode_hash.i];
  p->snode_hash.v = (SNode **)MALLOC(p->snode_hash.m * sizeof(*p->snode_hash.v));
  memset(p->snode_hash.v, 0, p->snode_hash.m * sizeof(*p->snode_hash.v));
  p->nshift_results = 0;
  p->ncode_shifts = 0;
}